

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_37e72::TestNotifiesReporterOfTestStartWithCorrectInfo::RunImpl
          (TestNotifiesReporterOfTestStartWithCorrectInfo *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int local_874;
  TestDetails local_870;
  TestResults results;
  RecordingReporter reporter;
  
  reporter.super_TestReporter._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150820;
  reporter.testRunCount = 0;
  reporter.testFailedCount = 0;
  reporter.lastFailedLine = 0;
  reporter.testFinishedCount = 0;
  reporter.lastStartedSuite[0] = '\0';
  reporter.lastStartedTest[0] = '\0';
  reporter.lastFailedFile[0] = '\0';
  reporter.lastFailedSuite[0] = '\0';
  reporter.lastFailedTest[0] = '\0';
  reporter.lastFailedMessage[0] = '\0';
  reporter.lastFinishedSuite[0] = '\0';
  reporter.lastFinishedTest[0] = '\0';
  reporter.lastFinishedTestTime = 0.0;
  reporter.summaryTotalTestCount = 0;
  reporter.summaryFailedTestCount = 0;
  reporter.summaryFailureCount = 0;
  reporter.summarySecondsElapsed = 0.0;
  UnitTest::TestResults::TestResults(&results,&reporter.super_TestReporter);
  UnitTest::TestResults::OnTestStart(&results,(TestDetails *)(anonymous_namespace)::details);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_874 = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x40);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_874,&reporter.testRunCount,&local_870);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x41);
  UnitTest::CheckEqual(pTVar1,"suitename",reporter.lastStartedSuite,&local_870);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,0x42);
  UnitTest::CheckEqual(pTVar1,"testname",reporter.lastStartedTest,&local_870);
  UnitTest::TestReporter::~TestReporter(&reporter.super_TestReporter);
  return;
}

Assistant:

TEST(RecordsNumbersOfTests)
{
    TestResults results;
    results.OnTestStart(details);
    results.OnTestStart(details);
    results.OnTestStart(details);
    CHECK_EQUAL(3, results.GetTotalTestCount());
}